

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O0

char * stumpless_get_param_name(stumpless_param *param)

{
  char *name_copy;
  stumpless_param *param_local;
  
  if (param == (stumpless_param *)0x0) {
    raise_argument_empty("param was NULL");
    param_local = (stumpless_param *)0x0;
  }
  else {
    lock_param(param);
    param_local = (stumpless_param *)alloc_mem(param->name_length + 1);
    if (param_local != (stumpless_param *)0x0) {
      memcpy(param_local,param,param->name_length);
      param_local->name[param->name_length] = '\0';
      clear_error();
    }
    unlock_param(param);
  }
  return param_local->name;
}

Assistant:

const char *
stumpless_get_param_name( const struct stumpless_param *param ) {
  char *name_copy;

  VALIDATE_ARG_NOT_NULL( param );

  lock_param( param );
  name_copy = alloc_mem( param->name_length + 1 );
  if( !name_copy ) {
    goto cleanup_and_return;
  }
  memcpy( name_copy, param->name, param->name_length );
  name_copy[param->name_length] = '\0';
  clear_error(  );

cleanup_and_return:
  unlock_param( param );
  return name_copy;
}